

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O2

void amrex::EB_interp_CC_to_Centroid
               (MultiFab *cent,MultiFab *cc,int scomp,int dcomp,int ncomp,Geometry *geom)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  FabType FVar5;
  EBFArrayBoxFactory *this;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  void *__s;
  long lVar10;
  size_t sVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  Periodicity PVar15;
  MFIter mfi;
  Box thread_box;
  long local_368;
  long local_360;
  Box local_354;
  size_t local_338;
  long local_330;
  long local_328;
  ulong local_320;
  ulong local_318;
  long local_310;
  long local_308;
  size_t local_300;
  int local_2f4;
  FabArray<amrex::FArrayBox> *local_2f0;
  FabArray<amrex::FArrayBox> *local_2e8;
  FabArray<amrex::EBCellFlagFab> *local_2e0;
  Array4<double> local_2d8;
  Geometry *local_298;
  MultiCutFab *local_290;
  MFIter local_288;
  Box local_228;
  Array4<const_double> local_208;
  Array4<const_double> local_1c8;
  Array4<const_amrex::EBCellFlag> local_188;
  anon_class_256_4_1798f1dc local_148;
  MFItInfo local_44;
  
  local_2e8 = &cent->super_FabArray<amrex::FArrayBox>;
  local_298 = geom;
  this = (EBFArrayBoxFactory *)
         __dynamic_cast((cc->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                        super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                        _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                        &EBFArrayBoxFactory::typeinfo,0);
  if (this == (EBFArrayBoxFactory *)0x0) {
    __cxa_bad_cast();
  }
  local_2e0 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this);
  local_290 = EBFArrayBoxFactory::getCentroid(this);
  local_44.do_tiling = false;
  local_44.dynamic = true;
  local_44.device_sync = true;
  local_44.num_streams = Gpu::Device::max_gpu_streams;
  local_44.tilesize.vect[0] = 0;
  local_44.tilesize.vect[1] = 0;
  local_44.tilesize.vect[2] = 0;
  local_2f0 = &cc->super_FabArray<amrex::FArrayBox>;
  MFIter::MFIter(&local_288,(FabArrayBase *)cc,&local_44);
  local_318 = 0;
  local_2f4 = ncomp;
  if (0 < ncomp) {
    local_318 = (ulong)(uint)ncomp;
  }
  while (iVar12 = local_2f4, uVar7 = local_318, local_288.currentIndex < local_288.endIndex) {
    MFIter::validbox(&local_354,&local_288);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_2d8,local_2e8,&local_288,dcomp);
    piVar6 = &local_288.currentIndex;
    if (local_288.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar6 = ((local_288.local_index_map)->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + local_288.currentIndex;
    }
    FVar5 = EBCellFlagFab::getType
                      ((local_2e0->m_fabs_v).
                       super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[*piVar6],&local_354);
    iVar3 = local_354.bigend.vect[1];
    iVar2 = local_354.bigend.vect[0];
    iVar1 = local_354.smallend.vect[0];
    if (FVar5 == regular) {
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&local_148,local_2f0,&local_288,scomp);
      local_328 = (long)local_354.smallend.vect[1];
      local_338 = (size_t)local_354.smallend.vect[2];
      local_330 = (long)local_354.smallend.vect[0] * 8;
      local_368 = 0;
      for (local_320 = 0; sVar4 = local_338, local_320 != uVar7; local_320 = local_320 + 1) {
        while (sVar11 = sVar4, (int)sVar11 <= local_354.bigend.vect[2]) {
          local_308 = (long)local_148.flag.begin.y;
          local_310 = (long)local_148.flag.begin.z;
          lVar14 = (long)local_2d8.p +
                   local_2d8.nstride * local_368 +
                   (local_328 - local_2d8.begin.y) * local_2d8.jstride * 8 +
                   (sVar11 - (long)local_2d8.begin.z) * local_2d8.kstride * 8 +
                   (long)local_2d8.begin.x * -8 + local_330;
          lVar9 = CONCAT44(local_148.flag.jstride._4_4_,(int)local_148.flag.jstride) * 8;
          lVar8 = (long)&local_148.flag.p
                         [(long)local_354.smallend.vect[0] * 2 +
                          (long)local_148.flag.begin.x * -2 +
                          (sVar11 - local_310) * local_148.flag.kstride * 2].flag +
                  local_148.flag.nstride * local_368 + (local_328 - local_308) * lVar9;
          for (lVar10 = local_328; lVar10 <= local_354.bigend.vect[1]; lVar10 = lVar10 + 1) {
            if (local_354.smallend.vect[0] <= local_354.bigend.vect[0]) {
              lVar13 = 0;
              do {
                *(undefined8 *)(lVar14 + lVar13 * 8) = *(undefined8 *)(lVar8 + lVar13 * 8);
                lVar13 = lVar13 + 1;
              } while ((local_354.bigend.vect[0] - local_354.smallend.vect[0]) + 1 != (int)lVar13);
            }
            lVar14 = lVar14 + local_2d8.jstride * 8;
            lVar8 = lVar8 + lVar9;
          }
          uVar7 = local_318;
          local_300 = sVar11;
          sVar4 = sVar11 + 1;
        }
        local_368 = local_368 + 8;
      }
    }
    else if (FVar5 == covered) {
      local_338 = CONCAT44(local_338._4_4_,local_354.smallend.vect[2]);
      local_310 = CONCAT44(local_310._4_4_,local_354.bigend.vect[2]);
      local_328 = (long)local_354.smallend.vect[0] << 3;
      local_320 = CONCAT44(local_320._4_4_,local_354.smallend.vect[1]);
      local_330 = (long)local_354.smallend.vect[1];
      local_300 = (ulong)(uint)(local_354.bigend.vect[0] - local_354.smallend.vect[0]) * 8 + 8;
      local_360 = 0;
      for (uVar7 = 0; uVar7 != local_318; uVar7 = uVar7 + 1) {
        iVar12 = (int)local_338;
        while (iVar12 <= (int)local_310) {
          lVar10 = local_2d8.jstride * 8;
          local_308 = CONCAT44(local_308._4_4_,iVar12);
          __s = (void *)((long)local_2d8.p +
                        local_2d8.nstride * local_360 +
                        (local_330 - local_2d8.begin.y) * lVar10 +
                        (iVar12 - local_2d8.begin.z) * local_2d8.kstride * 8 +
                        (long)local_2d8.begin.x * -8 + local_328);
          for (iVar12 = (int)local_320; iVar12 <= iVar3; iVar12 = iVar12 + 1) {
            if (iVar1 <= iVar2) {
              memset(__s,0,local_300);
            }
            __s = (void *)((long)__s + lVar10);
          }
          iVar12 = (int)local_308 + 1;
        }
        local_360 = local_360 + 8;
      }
    }
    else {
      FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                (&local_188,local_2e0,&local_288);
      MultiCutFab::const_array(&local_1c8,local_290,&local_288);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_208,local_2f0,&local_288,scomp);
      local_148.flag.end.z = local_188.end.z;
      local_148.flag.ncomp = local_188.ncomp;
      local_148.flag.begin.x = local_188.begin.x;
      local_148.flag.begin.y = local_188.begin.y;
      local_148.flag.begin.z = local_188.begin.z;
      local_148.flag.kstride = local_188.kstride;
      local_148.flag.nstride = local_188.nstride;
      local_148.flag.p = local_188.p;
      local_148.flag.jstride._0_4_ = (int)local_188.jstride;
      local_148.flag.jstride._4_4_ = (undefined4)((ulong)local_188.jstride >> 0x20);
      local_148.phicent.end.z = local_2d8.end.z;
      local_148.phicent.ncomp = local_2d8.ncomp;
      local_148.phicent.kstride = local_2d8.kstride;
      local_148.phicent.nstride = local_2d8.nstride;
      local_148.phicent.p = local_2d8.p;
      local_148.phicent.jstride = local_2d8.jstride;
      local_148.phicc.end.z = local_208.end.z;
      local_148.phicc.ncomp = local_208.ncomp;
      local_148.phicc.begin.x = local_208.begin.x;
      local_148.phicc.begin.y = local_208.begin.y;
      local_148.phicc.kstride = local_208.kstride;
      local_148.phicc.nstride = local_208.nstride;
      local_148.phicc.p = local_208.p;
      local_148.phicc.jstride = local_208.jstride;
      local_148.cent.end.z = local_1c8.end.z;
      local_148.cent.ncomp = local_1c8.ncomp;
      local_148.cent.begin.x = local_1c8.begin.x;
      local_148.cent.begin.y = local_1c8.begin.y;
      local_148.cent.kstride = local_1c8.kstride;
      local_148.cent.nstride = local_1c8.nstride;
      local_148.cent.p = local_1c8.p;
      local_148.cent.jstride = local_1c8.jstride;
      Loop<amrex::eb_interp_cc2cent(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,int)::_lambda(int,int,int,int)_1_>
                (&local_228,iVar12,&local_148);
    }
    MFIter::operator++(&local_288);
  }
  MFIter::~MFIter(&local_288);
  PVar15 = Geometry::periodicity(local_298);
  local_148.flag.p = PVar15.period.vect._0_8_;
  local_148.flag.jstride._0_4_ = PVar15.period.vect[2];
  FabArray<amrex::FArrayBox>::FillBoundary<double>
            (local_2e8,dcomp,iVar12,(Periodicity *)&local_148,false);
  return;
}

Assistant:

void
EB_interp_CC_to_Centroid (MultiFab& cent, const MultiFab& cc, int scomp, int dcomp, int ncomp, const Geometry& geom)
{
    const auto& factory = dynamic_cast<EBFArrayBoxFactory const&>(cc.Factory());
    const auto& flags = factory.getMultiEBCellFlagFab();
    const auto& loc = factory.getCentroid();

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(cc, mfi_info);  mfi.isValid(); ++mfi)
    {
        const Box& vbx = mfi.validbox();
        const auto& centfab = cent.array(mfi,dcomp);
        const auto& fabtyp = flags[mfi].getType(vbx);

        if (fabtyp == FabType::covered)
        {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( vbx, ncomp, i, j, k, n,
            {
                centfab(i,j,k,n) = 0.0;
            });
        }
        else if (fabtyp == FabType::regular)
        {
            const auto& ccfab = cc.array(mfi,scomp);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( vbx, ncomp, i, j, k, n,
            {
               centfab(i,j,k,n) = ccfab(i,j,k,n);
            });
        }
        else
        {
            const auto& flagfab = flags.const_array(mfi);
            const auto& locfab = loc.const_array(mfi);
            const auto& ccfab = cc.array(mfi,scomp);

            AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( vbx, thread_box,
            {
                eb_interp_cc2cent(thread_box, centfab, ccfab, flagfab, locfab, ncomp);
            });
        }
    }

    cent.FillBoundary(dcomp,ncomp,geom.periodicity());

}